

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_test.c
# Opt level: O0

void benchmark_wmutex_contended(testing t)

{
  undefined1 local_a8 [8];
  contended_state cs;
  testing t_local;
  
  cs._144_8_ = t;
  memset(local_a8,0,0x98);
  pthread_rwlock_init((pthread_rwlock_t *)((long)&cs.mutex + 0x20),(pthread_rwlockattr_t *)0x0);
  contended_state_run_test
            ((contended_state *)local_a8,(testing)cs._144_8_,(void *)((long)&cs.mutex + 0x20),
             void_pthread_rwlock_wrlock,void_pthread_rwlock_unlock);
  pthread_rwlock_destroy((pthread_rwlock_t *)((long)&cs.mutex + 0x20));
  return;
}

Assistant:

static void benchmark_wmutex_contended (testing t) {
	contended_state cs;
	memset ((void *) &cs, 0, sizeof (cs));
	pthread_rwlock_init (&cs.rwmutex, NULL);
	contended_state_run_test (&cs, t, &cs.rwmutex, &void_pthread_rwlock_wrlock,
				  &void_pthread_rwlock_unlock);
	pthread_rwlock_destroy (&cs.rwmutex);
}